

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::readSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceReplaceCase *this,Shader *shader)

{
  int iVar1;
  deUint32 shader_00;
  size_type sVar2;
  reference pvVar3;
  allocator<char> local_55 [20];
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> sourceBuffer;
  GLint sourceLength;
  Shader *shader_local;
  ShaderSourceReplaceCase *this_local;
  
  sourceBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       getSourceLength(this,shader);
  iVar1 = sourceBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,(long)iVar1,&local_41);
  std::allocator<char>::~allocator(&local_41);
  shader_00 = glu::Shader::getShader(shader);
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  glu::CallLogWrapper::glGetShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,(GLsizei)sVar2,(GLsizei *)0x0,
             pvVar3);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar3,local_55);
  std::allocator<char>::~allocator(local_55);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string readSource (glu::Shader& shader)
	{
		const GLint			sourceLength	= getSourceLength(shader);
		std::vector<char>	sourceBuffer	(sourceLength + 1);

		glGetShaderSource(shader.getShader(), (GLsizei)sourceBuffer.size(), 0, &sourceBuffer[0]);

		return std::string(&sourceBuffer[0]);
	}